

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_profile.c
# Opt level: O0

char * luaJIT_profile_dumpstack(lua_State *L,char *fmt,int depth,size_t *len)

{
  ulong *in_RCX;
  uint32_t in_EDI;
  SBuf *sb;
  ProfileState *ps;
  int in_stack_0000005c;
  char *in_stack_00000060;
  SBuf *in_stack_00000068;
  lua_State *in_stack_00000070;
  
  profile_state.sb.p = profile_state.sb.b;
  profile_state.sb.L.ptr32 = in_EDI;
  lj_debug_dumpstack(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c);
  *in_RCX = (ulong)(profile_state.sb.p.ptr32 - profile_state.sb.b.ptr32);
  return (char *)(ulong)profile_state.sb.b.ptr32;
}

Assistant:

LUA_API const char *luaJIT_profile_dumpstack(lua_State *L, const char *fmt,
					     int depth, size_t *len)
{
  ProfileState *ps = &profile_state;
  SBuf *sb = &ps->sb;
  setsbufL(sb, L);
  lj_buf_reset(sb);
  lj_debug_dumpstack(L, sb, fmt, depth);
  *len = (size_t)sbuflen(sb);
  return sbufB(sb);
}